

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O2

void __thiscall
cmOSXBundleGenerator::CreateCFBundle
          (cmOSXBundleGenerator *this,string *targetName,string *root,string *config)

{
  bool bVar1;
  char local_91;
  string name;
  string plist;
  string out;
  
  bVar1 = MustSkip(this);
  if (!bVar1) {
    name._M_dataplus._M_p._0_1_ = 0x2f;
    cmGeneratorTarget::GetCFBundleDirectory(&plist,this->GT,config,FullLevel);
    cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string>(&out,root,(char *)&name,&plist);
    std::__cxx11::string::~string((string *)&plist);
    cmsys::SystemTools::MakeDirectory(&out,(mode_t *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Makefile->OutputFiles,&out);
    local_91 = '/';
    cmGeneratorTarget::GetCFBundleDirectory(&name,this->GT,config,ContentLevel);
    cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char_const(&)[12]>
              (&plist,root,&local_91,&name,(char (*) [12])"/Info.plist");
    std::__cxx11::string::~string((string *)&name);
    cmsys::SystemTools::GetFilenameName(&name,targetName);
    cmLocalGenerator::GenerateAppleInfoPList(this->LocalGenerator,this->GT,&name,&plist);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Makefile->OutputFiles,&plist);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&plist);
    std::__cxx11::string::~string((string *)&out);
  }
  return;
}

Assistant:

void cmOSXBundleGenerator::CreateCFBundle(const std::string& targetName,
                                          const std::string& root,
                                          const std::string& config)
{
  if (this->MustSkip()) {
    return;
  }

  // Compute bundle directory names.
  std::string out = cmStrCat(
    root, '/',
    this->GT->GetCFBundleDirectory(config, cmGeneratorTarget::FullLevel));
  cmSystemTools::MakeDirectory(out);
  this->Makefile->AddCMakeOutputFile(out);

  // Configure the Info.plist file.  Note that it needs the executable name
  // to be set.
  std::string plist = cmStrCat(
    root, '/',
    this->GT->GetCFBundleDirectory(config, cmGeneratorTarget::ContentLevel),
    "/Info.plist");
  std::string name = cmSystemTools::GetFilenameName(targetName);
  this->LocalGenerator->GenerateAppleInfoPList(this->GT, name, plist);
  this->Makefile->AddCMakeOutputFile(plist);
}